

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O1

bool __thiscall
HdmiCecAnalyzer::ReadBlockByte(HdmiCecAnalyzer *this,int blockIndex,Frame *byteFrame)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  Frame FVar4;
  Frame *lastSample;
  byte bVar5;
  byte bVar6;
  Frame *firstSample;
  bool bVar7;
  bool value;
  bool local_3d;
  int local_3c;
  Frame *local_38;
  
  local_3c = blockIndex;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  bVar7 = false;
  bVar1 = ReadBit(this,&local_3d,(S64 *)byteFrame,(S64 *)0x0);
  bVar3 = local_3d << 7;
  bVar6 = 0;
  if (bVar1) {
    local_38 = byteFrame + 8;
    iVar2 = 6;
    do {
      bVar7 = iVar2 == -1;
      bVar6 = bVar3;
      if (bVar7) break;
      firstSample = (Frame *)0x0;
      if (iVar2 == 7) {
        firstSample = byteFrame;
      }
      lastSample = (Frame *)0x0;
      if (iVar2 == 0) {
        lastSample = local_38;
      }
      bVar1 = ReadBit(this,&local_3d,(S64 *)firstSample,(S64 *)lastSample);
      bVar6 = (byte)iVar2 & 0x1f;
      bVar5 = local_3d << bVar6;
      if (!bVar1) {
        bVar5 = (byte)(0 << bVar6);
      }
      bVar3 = bVar5 | bVar3;
      bVar6 = bVar3;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  if (bVar7) {
    *(ulong *)(byteFrame + 0x10) = (ulong)bVar6;
    bVar7 = true;
    FVar4 = (Frame)0x1;
    if (local_3c != 0) {
      if (local_3c == 1) {
        FVar4 = (Frame)0x2;
      }
      else {
        FVar4 = (Frame)0x3;
        if (0xf < local_3c) goto LAB_00106145;
      }
    }
    byteFrame[0x20] = FVar4;
  }
  else {
LAB_00106145:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool HdmiCecAnalyzer::ReadBlockByte( int blockIndex, Frame& byteFrame )
{
    // The bus should be in LOW
    if( mCec->GetBitState() == BIT_HIGH )
        mCec->AdvanceToNextEdge();

    // Read block byte
    bool value;
    U8 byte = 0;

    for( int bit = 7; bit >= 0; bit-- )
    {
        S64* firstSample = ( bit == 7 ) ? &byteFrame.mStartingSampleInclusive : 0;
        S64* lastSample = ( bit == 0 ) ? &byteFrame.mEndingSampleInclusive : 0;
        if( !ReadBit( value, firstSample, lastSample ) )
            return false;
        byte |= value << bit;
    }
    byteFrame.mData1 = byte;

    // Depending on the position on the message set blockByte type
    if( !blockIndex )
        byteFrame.mType = HdmiCec::FrameType_Header;
    else if( blockIndex == 1 )
        byteFrame.mType = HdmiCec::FrameType_OpCode;
    else if( blockIndex < HdmiCec::MaxMessageBlocks )
        byteFrame.mType = HdmiCec::FrameType_Operand;
    else
        return false;

    return true;
}